

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCVal(octet *cert,size_t cert_len,octet *certa,size_t certa_len,octet *date)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  btok_cvc_t *cvc;
  
  if ((date == (octet *)0x0) || (bVar1 = memIsValid(date,6), bVar1 != 0)) {
    cvc = (btok_cvc_t *)blobCreate(0x250);
    if (cvc == (btok_cvc_t *)0x0) {
      eVar2 = 0x6e;
    }
    else {
      eVar2 = btokCVCUnwrap(cvc + 1,certa,certa_len,(octet *)0x0,0);
      if (((eVar2 == 0) &&
          (eVar2 = btokCVCUnwrap(cvc,cert,cert_len,cvc[1].pubkey,cvc[1].pubkey_len), eVar2 == 0)) &&
         (eVar2 = btokCVCCheck2(cvc,cvc + 1), eVar2 == 0 && date != (octet *)0x0)) {
        bVar1 = tmDateIsValid2(date);
        if (bVar1 == 0) {
          eVar2 = 0x134;
        }
        else {
          iVar3 = memCmp(cvc->from,date,6);
          if ((iVar3 < 1) && (iVar3 = memCmp(date,cvc->until,6), iVar3 < 1)) {
            eVar2 = 0;
          }
          else {
            eVar2 = 0x136;
          }
        }
      }
      blobClose(cvc);
    }
  }
  else {
    eVar2 = 0x6d;
  }
  return eVar2;
}

Assistant:

err_t btokCVCVal(const octet cert[], size_t cert_len, 
	const octet certa[], size_t certa_len, const octet* date)
{
	err_t code;
	void* stack;
	btok_cvc_t* cvc;
	btok_cvc_t* cvca;
	// входной контроль
	if (!memIsNullOrValid(date, 6))
		return ERR_BAD_INPUT;
	// выделить и разметить память
	stack = blobCreate(2 * sizeof(btok_cvc_t));
	if (!stack)
		return ERR_OUTOFMEMORY;
	cvc = (btok_cvc_t*)stack;
	cvca = cvc + 1;
	// разобрать сертификаты
	code = btokCVCUnwrap(cvca, certa, certa_len, 0, 0);
	ERR_CALL_HANDLE(code, blobClose(stack));
	code = btokCVCUnwrap(cvc, cert, cert_len, cvca->pubkey, cvca->pubkey_len);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить соответствие
	code = btokCVCCheck2(cvc, cvca);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить дату
	if (date)
	{
		if (!tmDateIsValid2(date))
			code = ERR_BAD_DATE;
		else if (!tmDateLeq2(cvc->from, date) || !tmDateLeq2(date, cvc->until))
			code = ERR_OUTOFRANGE;
	}
	// завершить
	blobClose(stack);
	return code;
}